

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O3

void vector_suite::test_bool_empty(void)

{
  oarchive ar;
  ostringstream result;
  long *local_230 [2];
  long local_220 [2];
  vector<bool,_std::allocator<bool>_> local_210;
  undefined **local_1e8 [6];
  type local_1b8;
  pointer local_1a0;
  pointer local_190;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  trial::protocol::serialization::
  save_overloader<trial::protocol::json::basic_oarchive<char>,_std::vector<bool,_std::allocator<bool>_>,_void>
  ::save((basic_oarchive<char> *)local_1e8,&local_210,0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"[]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x19b,"void vector_suite::test_bool_empty()",local_230,"[]");
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  if (local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  local_1e8[0] = &PTR_vsave_001248d0;
  if (local_1a0 != (pointer)0x0) {
    operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
  }
  (**(code **)local_1b8._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_bool_empty()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::vector<bool> value;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[]");
}